

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ChParserAdams.cpp
# Opt level: O3

void __thiscall chrono::utils::ChParserAdams::Report::Print(Report *this)

{
  _Hash_node_base *p_Var1;
  undefined8 *puVar2;
  ostream *poVar3;
  unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<chrono::ChBodyAuxRef>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<chrono::ChBodyAuxRef>_>_>_>
  *__range2;
  
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"Parsed ",7);
  poVar3 = std::ostream::_M_insert<unsigned_long>((ulong)&std::cout);
  std::__ostream_insert<char,std::char_traits<char>>(poVar3," bodies:\n",9);
  for (p_Var1 = (this->bodies)._M_h._M_before_begin._M_nxt; p_Var1 != (_Hash_node_base *)0x0;
      p_Var1 = p_Var1->_M_nxt) {
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"   name: \"",10);
    poVar3 = std::__ostream_insert<char,std::char_traits<char>>
                       ((ostream *)&std::cout,(char *)p_Var1[1]._M_nxt,(long)p_Var1[2]._M_nxt);
    std::__ostream_insert<char,std::char_traits<char>>(poVar3,"\"",1);
    std::ios::widen((char)*(undefined8 *)(*(long *)poVar3 + -0x18) + (char)poVar3);
    std::ostream::put((char)poVar3);
    std::ostream::flush();
  }
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"Parsed ",7);
  poVar3 = std::ostream::_M_insert<unsigned_long>((ulong)&std::cout);
  std::__ostream_insert<char,std::char_traits<char>>(poVar3," joints:\n",9);
  for (puVar2 = *(undefined8 **)&this->field_0x48; puVar2 != (undefined8 *)0x0;
      puVar2 = (undefined8 *)*puVar2) {
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"   name: \"",10);
    poVar3 = std::__ostream_insert<char,std::char_traits<char>>
                       ((ostream *)&std::cout,(char *)puVar2[1],puVar2[2]);
    std::__ostream_insert<char,std::char_traits<char>>(poVar3,"\", type: \"",10);
    poVar3 = std::__ostream_insert<char,std::char_traits<char>>(poVar3,(char *)puVar2[5],puVar2[6]);
    std::__ostream_insert<char,std::char_traits<char>>(poVar3,"\"",1);
    std::ios::widen((char)*(undefined8 *)(*(long *)poVar3 + -0x18) + (char)poVar3);
    std::ostream::put((char)poVar3);
    std::ostream::flush();
  }
  return;
}

Assistant:

void ChParserAdams::Report::Print() const {
    std::cout << "Parsed " << bodies.size() << " bodies:\n";
    for (auto const& body : bodies) {
        std::cout << "   name: \"" << body.first << "\"" << std::endl;
    }

    std::cout << "Parsed " << joints.size() << " joints:\n";
    for (auto const& joint : joints) {
        std::cout << "   name: \"" << joint.first << "\", type: \"" << joint.second.type << "\"" << std::endl;
    }
}